

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

bool GetLogCategory(LogFlags *flag,string_view str)

{
  bool bVar1;
  LogFlags LVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  long local_10;
  
  local_20._M_str = str._M_str;
  local_20._M_len = str._M_len;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  LVar2 = ALL;
  if (local_20._M_len != 0) {
    if (local_20._M_len == 3) {
      if ((char)*(short *)((long)local_20._M_str + 2) != 'l' || *(short *)local_20._M_str != 0x6c61)
      goto LAB_0016e10f;
    }
    else if ((local_20._M_len != 1) || ((char)*(short *)local_20._M_str != '1')) {
LAB_0016e10f:
      cVar3 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BCLog::LogFlags>,std::_Select1st<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
              ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BCLog::LogFlags>,std::_Select1st<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
                          *)&LOG_CATEGORIES_BY_STR_abi_cxx11_,&local_20);
      if ((_Rb_tree_header *)cVar3._M_node ==
          &LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        bVar1 = false;
        goto LAB_0016e135;
      }
      LVar2 = *(LogFlags *)(cVar3._M_node + 2);
    }
  }
  *flag = LVar2;
  bVar1 = true;
LAB_0016e135:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool GetLogCategory(BCLog::LogFlags& flag, std::string_view str)
{
    if (str.empty() || str == "1" || str == "all") {
        flag = BCLog::ALL;
        return true;
    }
    auto it = LOG_CATEGORIES_BY_STR.find(str);
    if (it != LOG_CATEGORIES_BY_STR.end()) {
        flag = it->second;
        return true;
    }
    return false;
}